

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field)

{
  pointer *pppEVar1;
  size_t *psVar2;
  pointer *pppFVar3;
  pointer *pppMVar4;
  pointer *pppGVar5;
  pointer *pppTVar6;
  pointer *pppIVar7;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  iterator __position_03;
  ImportModuleField *pIVar8;
  iterator __position_04;
  ModuleField *pMVar9;
  ModuleFieldList *pMVar10;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var11;
  int iVar12;
  Func *pFVar13;
  Import *import;
  _Head_base<0UL,_wabt::Import_*,_false> local_50;
  Func *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  int local_28;
  
  local_50._M_head_impl =
       *(Import **)
        &(((field->_M_t).
           super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import)._M_t.
         super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>;
  switch((local_50._M_head_impl)->kind_) {
  case First:
    pFVar13 = (Func *)(local_50._M_head_impl + 1);
    __position._M_current =
         (this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar12 = (int)((ulong)((long)__position._M_current -
                          (long)(this->funcs).
                                super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48 = pFVar13;
    if (__position._M_current ==
        (this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Func*,std::allocator<wabt::Func*>>::_M_realloc_insert<wabt::Func*>
                ((vector<wabt::Func*,std::allocator<wabt::Func*>> *)&this->funcs,__position,
                 &local_48);
    }
    else {
      *__position._M_current = pFVar13;
      pppFVar3 = &(this->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppFVar3 = *pppFVar3 + 1;
    }
    p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->func_bindings;
    this->num_func_imports = this->num_func_imports + 1;
    break;
  case Table:
    pFVar13 = (Func *)(local_50._M_head_impl + 1);
    __position_03._M_current =
         (this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar12 = (int)((ulong)((long)__position_03._M_current -
                          (long)(this->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48 = pFVar13;
    if (__position_03._M_current ==
        (this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Table*,std::allocator<wabt::Table*>>::_M_realloc_insert<wabt::Table*>
                ((vector<wabt::Table*,std::allocator<wabt::Table*>> *)&this->tables,__position_03,
                 (Table **)&local_48);
    }
    else {
      *__position_03._M_current = (Table *)pFVar13;
      pppTVar6 = &(this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar6 = *pppTVar6 + 1;
    }
    p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->table_bindings;
    this->num_table_imports = this->num_table_imports + 1;
    break;
  case Memory:
    pFVar13 = (Func *)(local_50._M_head_impl + 1);
    __position_01._M_current =
         (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    iVar12 = (int)((ulong)((long)__position_01._M_current -
                          (long)(this->memories).
                                super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48 = pFVar13;
    if (__position_01._M_current ==
        (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::_M_realloc_insert<wabt::Memory*>
                ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,
                 __position_01,(Memory **)&local_48);
    }
    else {
      *__position_01._M_current = (Memory *)pFVar13;
      pppMVar4 = &(this->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppMVar4 = *pppMVar4 + 1;
    }
    p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->memory_bindings;
    this->num_memory_imports = this->num_memory_imports + 1;
    break;
  case Global:
    pFVar13 = (Func *)(local_50._M_head_impl + 1);
    __position_02._M_current =
         (this->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    iVar12 = (int)((ulong)((long)__position_02._M_current -
                          (long)(this->globals).
                                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48 = pFVar13;
    if (__position_02._M_current ==
        (this->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Global*,std::allocator<wabt::Global*>>::_M_realloc_insert<wabt::Global*>
                ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,__position_02
                 ,(Global **)&local_48);
    }
    else {
      *__position_02._M_current = (Global *)pFVar13;
      pppGVar5 = &(this->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppGVar5 = *pppGVar5 + 1;
    }
    p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->global_bindings;
    this->num_global_imports = this->num_global_imports + 1;
    break;
  case Event:
    pFVar13 = (Func *)(local_50._M_head_impl + 1);
    __position_00._M_current =
         (this->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar12 = (int)((ulong)((long)__position_00._M_current -
                          (long)(this->events).
                                super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48 = pFVar13;
    if (__position_00._M_current ==
        (this->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Event*,std::allocator<wabt::Event*>>::_M_realloc_insert<wabt::Event*>
                ((vector<wabt::Event*,std::allocator<wabt::Event*>> *)&this->events,__position_00,
                 (Event **)&local_48);
    }
    else {
      *__position_00._M_current = (Event *)pFVar13;
      pppEVar1 = &(this->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
    p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)&this->event_bindings;
    this->num_event_imports = this->num_event_imports + 1;
    break;
  default:
    iVar12 = -1;
    p_Var11 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
               *)0x0;
    pFVar13 = (Func *)0x0;
  }
  if (((iVar12 != -1) && (pFVar13 != (Func *)0x0)) &&
     (p_Var11 !=
      (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
       *)0x0)) {
    if ((pFVar13->name)._M_string_length != 0) {
      pIVar8 = (field->_M_t).
               super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
      local_48 = (Func *)(((Location *)
                          ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                                  super_ModuleField + 0x18))->filename).data_;
      uStack_40 = *(undefined4 *)
                   ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x20);
      uStack_3c = *(undefined4 *)
                   ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x24);
      local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                  ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                          super_ModuleField + 0x28))->field_0).line;
      uStack_34 = *(undefined4 *)
                   ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x2c);
      uStack_30 = *(undefined4 *)
                   ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x30);
      uStack_2c = *(undefined4 *)
                   ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                           super_ModuleField + 0x34);
      local_28 = iVar12;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string_const&,wabt::Binding>(p_Var11,0,pFVar13);
    }
    __position_04._M_current =
         (this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position_04._M_current ==
        (this->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Import*,std::allocator<wabt::Import*>>::
      _M_realloc_insert<wabt::Import*const&>
                ((vector<wabt::Import*,std::allocator<wabt::Import*>> *)&this->imports,__position_04
                 ,&local_50._M_head_impl);
    }
    else {
      *__position_04._M_current = local_50._M_head_impl;
      pppIVar7 = &(this->imports).
                  super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppIVar7 = *pppIVar7 + 1;
    }
    pIVar8 = (field->_M_t).
             super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
    (field->_M_t).
    super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl = (ImportModuleField *)0x0
    ;
    if ((*(ModuleField **)
          ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField +
          0x10) == (ModuleField *)0x0) &&
       (((intrusive_list_base<wabt::ModuleField> *)
        ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 8))->
        next_ == (ModuleField *)0x0)) {
      pMVar9 = (this->fields).last_;
      if (pMVar9 == (ModuleField *)0x0) {
        pMVar10 = &this->fields;
      }
      else {
        *(ModuleField **)
         ((long)&(pIVar8->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField + 0x10
         ) = pMVar9;
        pMVar10 = (ModuleFieldList *)&pMVar9->super_intrusive_list_base<wabt::ModuleField>;
      }
      pMVar10->first_ = (ModuleField *)pIVar8;
      (this->fields).last_ = (ModuleField *)pIVar8;
      psVar2 = &(this->fields).size_;
      *psVar2 = *psVar2 + 1;
      return;
    }
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x1bf,
                  "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                 );
  }
  __assert_fail("name && bindings && index != kInvalidIndex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.cc",
                0x1ce,"void wabt::Module::AppendField(std::unique_ptr<ImportModuleField>)");
}

Assistant:

void Module::AppendField(std::unique_ptr<ImportModuleField> field) {
  Import* import = field->import.get();
  const std::string* name = nullptr;
  BindingHash* bindings = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func: {
      Func& func = cast<FuncImport>(import)->func;
      name = &func.name;
      bindings = &func_bindings;
      index = funcs.size();
      funcs.push_back(&func);
      ++num_func_imports;
      break;
    }

    case ExternalKind::Table: {
      Table& table = cast<TableImport>(import)->table;
      name = &table.name;
      bindings = &table_bindings;
      index = tables.size();
      tables.push_back(&table);
      ++num_table_imports;
      break;
    }

    case ExternalKind::Memory: {
      Memory& memory = cast<MemoryImport>(import)->memory;
      name = &memory.name;
      bindings = &memory_bindings;
      index = memories.size();
      memories.push_back(&memory);
      ++num_memory_imports;
      break;
    }

    case ExternalKind::Global: {
      Global& global = cast<GlobalImport>(import)->global;
      name = &global.name;
      bindings = &global_bindings;
      index = globals.size();
      globals.push_back(&global);
      ++num_global_imports;
      break;
    }

    case ExternalKind::Event: {
      Event& event = cast<EventImport>(import)->event;
      name = &event.name;
      bindings = &event_bindings;
      index = events.size();
      events.push_back(&event);
      ++num_event_imports;
      break;
    }
  }

  assert(name && bindings && index != kInvalidIndex);
  if (!name->empty()) {
    bindings->emplace(*name, Binding(field->loc, index));
  }
  imports.push_back(import);
  fields.push_back(std::move(field));
}